

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void liblogger::LogManager::FilterRemove(shared_ptr<liblogger::ILogFilter> *filter)

{
  LogException *this;
  long lVar1;
  LogManagerScopedLock lock;
  string local_40;
  
  LogMutex::Lock((LogMutex *)m_mutex);
  lVar1 = DAT_001463d8;
  std::__cxx11::
  list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
  ::remove((list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
            *)&m_filters_abi_cxx11_,(char *)filter);
  if (lVar1 != DAT_001463d8) {
    LogMutex::Unlock((LogMutex *)m_mutex);
    return;
  }
  this = (LogException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"LogManager::FilterRemove cannot find filter module","");
  LogException::LogException(this,&local_40);
  __cxa_throw(this,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogManager::FilterRemove(std::shared_ptr<ILogFilter> filter)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	size_t size = m_filters.size();
	m_filters.remove(filter);
	if (size == m_filters.size())
		throw(LogException("LogManager::FilterRemove cannot find filter module"));
}